

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls_wrapper.cpp
# Opt level: O2

mbedtls_cipher_info_t * __thiscall
duckdb_mbedtls::MbedTlsWrapper::AESStateMBEDTLS::GetCipher(AESStateMBEDTLS *this,size_t key_len)

{
  mbedtls_cipher_info_t *pmVar1;
  InternalException *this_00;
  runtime_error *this_01;
  mbedtls_cipher_type_t mStack_50;
  allocator local_39;
  string local_38;
  
  if (this->cipher == CTR) {
    if (key_len == 0x10) {
      mStack_50 = MBEDTLS_CIPHER_AES_128_CTR;
    }
    else if (key_len == 0x20) {
      mStack_50 = MBEDTLS_CIPHER_AES_256_CTR;
    }
    else {
      if (key_len != 0x18) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"Invalid AES key length");
        goto LAB_01f280fc;
      }
      mStack_50 = MBEDTLS_CIPHER_AES_192_CTR;
    }
  }
  else {
    if (this->cipher != GCM) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_38,"Invalid Encryption/Decryption Cipher: %d",&local_39);
      duckdb::InternalException::InternalException<int>(this_00,&local_38,this->cipher);
      __cxa_throw(this_00,&duckdb::InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
    if (key_len == 0x10) {
      mStack_50 = MBEDTLS_CIPHER_AES_128_GCM;
    }
    else if (key_len == 0x20) {
      mStack_50 = MBEDTLS_CIPHER_AES_256_GCM;
    }
    else {
      if (key_len != 0x18) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"Invalid AES key length");
LAB_01f280fc:
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      mStack_50 = MBEDTLS_CIPHER_AES_192_GCM;
    }
  }
  pmVar1 = mbedtls_cipher_info_from_type(mStack_50);
  return pmVar1;
}

Assistant:

const mbedtls_cipher_info_t *MbedTlsWrapper::AESStateMBEDTLS::GetCipher(size_t key_len){

	switch(cipher){
		case GCM:
		    switch (key_len) {
		    case 16:
			    return mbedtls_cipher_info_from_type(MBEDTLS_CIPHER_AES_128_GCM);
		    case 24:
			    return mbedtls_cipher_info_from_type(MBEDTLS_CIPHER_AES_192_GCM);
		    case 32:
			    return mbedtls_cipher_info_from_type(MBEDTLS_CIPHER_AES_256_GCM);
		    default:
			    throw runtime_error("Invalid AES key length");
		    }

		case CTR:
		    switch (key_len) {
		    case 16:
			    return mbedtls_cipher_info_from_type(MBEDTLS_CIPHER_AES_128_CTR);
		    case 24:
			    return mbedtls_cipher_info_from_type(MBEDTLS_CIPHER_AES_192_CTR);
		    case 32:
			    return mbedtls_cipher_info_from_type(MBEDTLS_CIPHER_AES_256_CTR);
		    default:
			    throw runtime_error("Invalid AES key length");
		    }

		default:
			throw duckdb::InternalException("Invalid Encryption/Decryption Cipher: %d", static_cast<int>(cipher));
	}
}